

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugLine::LineTable::clear(LineTable *this)

{
  pointer pRVar1;
  pointer pSVar2;
  
  Prologue::clear(&this->Prologue);
  pRVar1 = (this->Rows).
           super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar1) {
    (this->Rows).
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_finish = pRVar1;
  }
  pSVar2 = (this->Sequences).
           super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->Sequences).
      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar2) {
    (this->Sequences).
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar2;
  }
  return;
}

Assistant:

void DWARFDebugLine::LineTable::clear() {
  Prologue.clear();
  Rows.clear();
  Sequences.clear();
}